

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_Bob(player_t *player,DAngle *angle,double move,bool forward)

{
  uint uVar1;
  double dVar2;
  bool local_39;
  TVector2<double> local_38;
  TFlags<ActorFlag,_unsigned_int> local_28;
  undefined1 local_21;
  double dStack_20;
  bool forward_local;
  double move_local;
  DAngle *angle_local;
  player_t *player_local;
  
  local_39 = false;
  local_21 = forward;
  dStack_20 = move;
  move_local = (double)angle;
  angle_local = (DAngle *)player;
  if (forward) {
    if ((player->mo->super_AActor).waterlevel == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_28,
                 (int)player->mo +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_28);
      local_39 = false;
      if (uVar1 == 0) goto LAB_0061f215;
    }
    local_39 = TAngle<double>::operator!=((TAngle<double> *)((long)angle_local->Degrees + 0xa8),0.0)
    ;
  }
LAB_0061f215:
  if (local_39 != false) {
    dVar2 = TAngle<double>::Cos((TAngle<double> *)((long)angle_local->Degrees + 0xa8));
    dStack_20 = dVar2 * dStack_20;
  }
  TAngle<double>::ToVector((TAngle<double> *)&local_38,dStack_20);
  TVector2<double>::operator+=((TVector2<double> *)(angle_local + 0x10),&local_38);
  return;
}

Assistant:

void P_Bob (player_t *player, DAngle angle, double move, bool forward)
{
	if (forward
		&& (player->mo->waterlevel || (player->mo->flags & MF_NOGRAVITY))
		&& player->mo->Angles.Pitch != 0)
	{
		move *= player->mo->Angles.Pitch.Cos();
	}
	player->Vel += angle.ToVector(move);
}